

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

sexp_conflict sexp_lookup_source_info(sexp_conflict src,int ip)

{
  long lVar1;
  sexp_uint_t sVar2;
  sexp_conflict psVar3;
  anon_union_24768_35_b8e82fc1_for_value *paVar4;
  long lVar5;
  
  if (src == (sexp_conflict)0x0) {
    src = (sexp_conflict)0x0;
  }
  else if ((((ulong)src & 3) == 0) && (src->tag == 0x14)) {
    src = (((src->value).type.name)->value).type.slots;
  }
  psVar3 = (sexp_conflict)&DAT_0000003e;
  if (((((ulong)src & 3) == 0 && src != (sexp_conflict)0x0) && (src->tag == 10)) &&
     (sVar2 = (src->value).stack.length, sVar2 != 0)) {
    paVar4 = &src->value;
    lVar5 = 1;
    do {
      if ((int)sVar2 <= lVar5) {
        paVar4 = (anon_union_24768_35_b8e82fc1_for_value *)((long)&src->value + sVar2 * 8);
        break;
      }
      lVar1 = lVar5 * 8;
      lVar5 = lVar5 + 1;
      paVar4 = (anon_union_24768_35_b8e82fc1_for_value *)&(paVar4->type).cpl;
    } while (*(long *)(*(long *)((long)&src->value + lVar1 + 8) + 8) >> 1 <= (long)ip);
    psVar3 = (((paVar4->type).name)->value).type.cpl;
  }
  return psVar3;
}

Assistant:

static sexp sexp_lookup_source_info (sexp src, int ip) {
  int i;
  if (src && sexp_procedurep(src))
    src = sexp_procedure_source(src);
  if (src && sexp_vectorp(src) && sexp_vector_length(src) > 0) {
    for (i=1; i<(int)sexp_vector_length(src); i++)
      if (sexp_unbox_fixnum(sexp_car(sexp_vector_ref(src, sexp_make_fixnum(i)))) > ip)
        return sexp_cdr(sexp_vector_ref(src, sexp_make_fixnum(i-1)));
    return sexp_cdr(sexp_vector_ref(src, sexp_make_fixnum(sexp_vector_length(src)-1)));
  }
  return SEXP_FALSE;
}